

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O0

void av1_highbd_iwht4x4_1_add_c(tran_low_t *in,uint8_t *dest8,int dest_stride,int bd)

{
  uint16_t uVar1;
  uint16_t *puVar2;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  uint16_t *dest;
  tran_low_t *op;
  tran_low_t *ip;
  tran_low_t tmp [4];
  tran_low_t e1;
  tran_low_t a1;
  int i;
  tran_high_t in_stack_ffffffffffffffa8;
  int *local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_24;
  int local_20;
  int local_1c;
  int local_14;
  
  puVar2 = (uint16_t *)(in_RSI << 1);
  local_2c = *in_RDI >> 3;
  local_38 = (*in_RDI >> 2) - local_2c;
  local_30 = local_2c;
  local_34 = local_2c;
  local_40 = &local_38;
  local_14 = in_EDX;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    local_24 = *local_40 >> 1;
    local_20 = *local_40 - local_24;
    uVar1 = highbd_clip_pixel_add((uint16_t)((ulong)puVar2 >> 0x30),in_stack_ffffffffffffffa8,0);
    *puVar2 = uVar1;
    uVar1 = highbd_clip_pixel_add((uint16_t)((ulong)puVar2 >> 0x30),in_stack_ffffffffffffffa8,0);
    puVar2[local_14] = uVar1;
    uVar1 = highbd_clip_pixel_add((uint16_t)((ulong)puVar2 >> 0x30),in_stack_ffffffffffffffa8,0);
    puVar2[local_14 << 1] = uVar1;
    uVar1 = highbd_clip_pixel_add((uint16_t)((ulong)puVar2 >> 0x30),in_stack_ffffffffffffffa8,0);
    puVar2[local_14 * 3] = uVar1;
    local_40 = local_40 + 1;
    puVar2 = puVar2 + 1;
  }
  return;
}

Assistant:

void av1_highbd_iwht4x4_1_add_c(const tran_low_t *in, uint8_t *dest8,
                                int dest_stride, int bd) {
  int i;
  tran_low_t a1, e1;
  tran_low_t tmp[4];
  const tran_low_t *ip = in;
  tran_low_t *op = tmp;
  uint16_t *dest = CONVERT_TO_SHORTPTR(dest8);
  (void)bd;

  a1 = ip[0 * 4] >> UNIT_QUANT_SHIFT;
  e1 = a1 >> 1;
  a1 -= e1;
  op[0] = a1;
  op[1] = op[2] = op[3] = e1;

  ip = tmp;
  for (i = 0; i < 4; i++) {
    e1 = ip[0] >> 1;
    a1 = ip[0] - e1;
    dest[dest_stride * 0] =
        highbd_clip_pixel_add(dest[dest_stride * 0], a1, bd);
    dest[dest_stride * 1] =
        highbd_clip_pixel_add(dest[dest_stride * 1], e1, bd);
    dest[dest_stride * 2] =
        highbd_clip_pixel_add(dest[dest_stride * 2], e1, bd);
    dest[dest_stride * 3] =
        highbd_clip_pixel_add(dest[dest_stride * 3], e1, bd);
    ip++;
    dest++;
  }
}